

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadBoundThreadContextManager.cpp
# Opt level: O0

void ThreadBoundThreadContextManager::DestroyContextAndEntryForCurrentThread(void)

{
  bool bVar1;
  CriticalSection *cs;
  ThreadContext *this;
  ThreadContext *threadContext;
  ThreadContextTLSEntry *local_18;
  ThreadContextTLSEntry *entry;
  AutoCriticalSection lock;
  
  cs = ThreadContext::GetCriticalSection();
  AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&entry,cs);
  local_18 = ThreadContextTLSEntry::GetEntryForCurrentThread();
  if (local_18 != (ThreadContextTLSEntry *)0x0) {
    this = ThreadContextTLSEntry::GetThreadContext(local_18);
    DList<ThreadContextTLSEntry_*,_Memory::HeapAllocator,_RealCount>::Remove(&entries,&local_18);
    if ((this != (ThreadContext *)0x0) && (bVar1 = ThreadContext::IsThreadBound(this), bVar1)) {
      ThreadContextManagerBase::ShutdownThreadContext(this,true);
    }
    ThreadContextTLSEntry::CleanupThread();
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&entry);
  return;
}

Assistant:

void ThreadBoundThreadContextManager::DestroyContextAndEntryForCurrentThread()
{
    AutoCriticalSection lock(ThreadContext::GetCriticalSection());

    ThreadContextTLSEntry * entry = ThreadContextTLSEntry::GetEntryForCurrentThread();

    if (entry == NULL)
    {
        return;
    }

    ThreadContext * threadContext = static_cast<ThreadContext *>(entry->GetThreadContext());
    entries.Remove(entry);

    if (threadContext != NULL && threadContext->IsThreadBound())
    {
        ShutdownThreadContext(threadContext);
    }

    ThreadContextTLSEntry::CleanupThread();
}